

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

char * ARKodeGetReturnFlagName(long flag)

{
  char *__s;
  undefined8 in_RDI;
  char *name;
  
  __s = (char *)malloc(0x1b);
  switch(in_RDI) {
  case 0:
    sprintf(__s,"ARK_SUCCESS");
    break;
  case 1:
    sprintf(__s,"ARK_TSTOP_RETURN");
    break;
  case 2:
    sprintf(__s,"ARK_ROOT_RETURN");
    break;
  case 99:
    sprintf(__s,"ARK_WARNING");
    break;
  case 0xffffffffffffff9d:
    sprintf(__s,"ARK_UNRECOGNIZED_ERROR");
    break;
  default:
    sprintf(__s,"NONE");
    break;
  case 0xffffffffffffffd0:
    sprintf(__s,"ARK_STEPPER_UNSUPPORTED");
    break;
  case 0xffffffffffffffd1:
    sprintf(__s,"ARK_CONTROLLER_ERR");
    break;
  case 0xffffffffffffffd2:
    sprintf(__s,"ARK_RELAX_JAC_FAIL");
    break;
  case 0xffffffffffffffd3:
    sprintf(__s,"ARK_RELAX_FUNC_FAIL");
    break;
  case 0xffffffffffffffd4:
    sprintf(__s,"ARK_RELAX_MEM_NULL");
    break;
  case 0xffffffffffffffd5:
    sprintf(__s,"ARK_RELAX_FAIL");
    break;
  case 0xffffffffffffffd6:
    sprintf(__s,"ARK_CONTEXT_ERR");
    break;
  case 0xffffffffffffffd7:
    sprintf(__s,"ARK_INVALID_TABLE");
    break;
  case 0xffffffffffffffd8:
    sprintf(__s,"ARK_INTERP_FAIL");
    break;
  case 0xffffffffffffffd9:
    sprintf(__s,"ARK_USER_PREDICT_FAIL");
    break;
  case 0xffffffffffffffda:
    sprintf(__s,"ARK_POSTPROCESS_STAGE_FAIL");
    break;
  case 0xffffffffffffffdb:
    sprintf(__s,"ARK_POSTPROCESS_STEP_FAIL");
    break;
  case 0xffffffffffffffdc:
    sprintf(__s,"ARK_INNERTOOUTER_FAIL");
    break;
  case 0xffffffffffffffdd:
    sprintf(__s,"ARK_OUTERTOINNER_FAIL");
    break;
  case 0xffffffffffffffde:
    sprintf(__s,"ARK_INNERSTEP_FAIL");
    break;
  case 0xffffffffffffffdf:
    sprintf(__s,"ARK_INNERSTEP_ATTACH_ERR");
    break;
  case 0xffffffffffffffe0:
    sprintf(__s,"ARK_NLS_OP_ERR");
    break;
  case 0xffffffffffffffe1:
    sprintf(__s,"ARK_NLS_SETUP_RECVR");
    break;
  case 0xffffffffffffffe2:
    sprintf(__s,"ARK_NLS_SETUP_FAIL");
    break;
  case 0xffffffffffffffe3:
    sprintf(__s,"ARK_NLS_INIT_FAIL");
    break;
  case 0xffffffffffffffe4:
    sprintf(__s,"ARK_VECTOROP_ERR");
    break;
  case 0xffffffffffffffe5:
    sprintf(__s,"ARK_TOO_CLOSE");
    break;
  case 0xffffffffffffffe6:
    sprintf(__s,"ARK_BAD_DKY");
    break;
  case 0xffffffffffffffe7:
    sprintf(__s,"ARK_BAD_T");
    break;
  case 0xffffffffffffffe8:
    sprintf(__s,"ARK_BAD_K");
    break;
  case 0xffffffffffffffe9:
    sprintf(__s,"ARK_NO_MALLOC");
    break;
  case 0xffffffffffffffea:
    sprintf(__s,"ARK_ILL_INPUT");
    break;
  case 0xffffffffffffffeb:
    sprintf(__s,"ARK_MEM_NULL");
    break;
  case 0xffffffffffffffec:
    sprintf(__s,"ARK_MEM_FAIL");
    break;
  case 0xffffffffffffffed:
    sprintf(__s,"ARK_CONSTR_FAIL");
    break;
  case 0xffffffffffffffee:
    sprintf(__s,"ARK_MASSMULT_FAIL");
    break;
  case 0xffffffffffffffef:
    sprintf(__s,"ARK_MASSFREE_FAIL");
    break;
  case 0xfffffffffffffff0:
    sprintf(__s,"ARK_MASSSOLVE_FAIL");
    break;
  case 0xfffffffffffffff1:
    sprintf(__s,"ARK_MASSSETUP_FAIL");
    break;
  case 0xfffffffffffffff2:
    sprintf(__s,"ARK_MASSINIT_FAIL");
    break;
  case 0xfffffffffffffff3:
    sprintf(__s,"ARK_LFREE_FAIL");
    break;
  case 0xfffffffffffffff4:
    sprintf(__s,"ARK_RTFUNC_FAIL");
    break;
  case 0xfffffffffffffff5:
    sprintf(__s,"ARK_UNREC_RHSFUNC_ERR");
    break;
  case 0xfffffffffffffff6:
    sprintf(__s,"ARK_REPTD_RHSFUNC_ERR");
    break;
  case 0xfffffffffffffff7:
    sprintf(__s,"ARK_FIRST_RHSFUNC_ERR");
    break;
  case 0xfffffffffffffff8:
    sprintf(__s,"ARK_RHSFUNC_FAIL");
    break;
  case 0xfffffffffffffff9:
    sprintf(__s,"ARK_LSOLVE_FAIL");
    break;
  case 0xfffffffffffffffa:
    sprintf(__s,"ARK_LSETUP_FAIL");
    break;
  case 0xfffffffffffffffb:
    sprintf(__s,"ARK_LINIT_FAIL");
    break;
  case 0xfffffffffffffffc:
    sprintf(__s,"ARK_CONV_FAILURE");
    break;
  case 0xfffffffffffffffd:
    sprintf(__s,"ARK_ERR_FAILURE");
    break;
  case 0xfffffffffffffffe:
    sprintf(__s,"ARK_TOO_MUCH_ACC");
    break;
  case 0xffffffffffffffff:
    sprintf(__s,"ARK_TOO_MUCH_WORK");
  }
  return __s;
}

Assistant:

char* ARKodeGetReturnFlagName(long int flag)
{
  char* name;
  name = (char*)malloc(27 * sizeof(char));

  switch (flag)
  {
  case ARK_SUCCESS: sprintf(name, "ARK_SUCCESS"); break;
  case ARK_TSTOP_RETURN: sprintf(name, "ARK_TSTOP_RETURN"); break;
  case ARK_ROOT_RETURN: sprintf(name, "ARK_ROOT_RETURN"); break;
  case ARK_WARNING: sprintf(name, "ARK_WARNING"); break;
  case ARK_TOO_MUCH_WORK: sprintf(name, "ARK_TOO_MUCH_WORK"); break;
  case ARK_TOO_MUCH_ACC: sprintf(name, "ARK_TOO_MUCH_ACC"); break;
  case ARK_ERR_FAILURE: sprintf(name, "ARK_ERR_FAILURE"); break;
  case ARK_CONV_FAILURE: sprintf(name, "ARK_CONV_FAILURE"); break;
  case ARK_LINIT_FAIL: sprintf(name, "ARK_LINIT_FAIL"); break;
  case ARK_LSETUP_FAIL: sprintf(name, "ARK_LSETUP_FAIL"); break;
  case ARK_LSOLVE_FAIL: sprintf(name, "ARK_LSOLVE_FAIL"); break;
  case ARK_RHSFUNC_FAIL: sprintf(name, "ARK_RHSFUNC_FAIL"); break;
  case ARK_FIRST_RHSFUNC_ERR: sprintf(name, "ARK_FIRST_RHSFUNC_ERR"); break;
  case ARK_REPTD_RHSFUNC_ERR: sprintf(name, "ARK_REPTD_RHSFUNC_ERR"); break;
  case ARK_UNREC_RHSFUNC_ERR: sprintf(name, "ARK_UNREC_RHSFUNC_ERR"); break;
  case ARK_RTFUNC_FAIL: sprintf(name, "ARK_RTFUNC_FAIL"); break;
  case ARK_LFREE_FAIL: sprintf(name, "ARK_LFREE_FAIL"); break;
  case ARK_MASSINIT_FAIL: sprintf(name, "ARK_MASSINIT_FAIL"); break;
  case ARK_MASSSETUP_FAIL: sprintf(name, "ARK_MASSSETUP_FAIL"); break;
  case ARK_MASSSOLVE_FAIL: sprintf(name, "ARK_MASSSOLVE_FAIL"); break;
  case ARK_MASSFREE_FAIL: sprintf(name, "ARK_MASSFREE_FAIL"); break;
  case ARK_MASSMULT_FAIL: sprintf(name, "ARK_MASSMULT_FAIL"); break;
  case ARK_CONSTR_FAIL: sprintf(name, "ARK_CONSTR_FAIL"); break;
  case ARK_MEM_FAIL: sprintf(name, "ARK_MEM_FAIL"); break;
  case ARK_MEM_NULL: sprintf(name, "ARK_MEM_NULL"); break;
  case ARK_ILL_INPUT: sprintf(name, "ARK_ILL_INPUT"); break;
  case ARK_NO_MALLOC: sprintf(name, "ARK_NO_MALLOC"); break;
  case ARK_BAD_K: sprintf(name, "ARK_BAD_K"); break;
  case ARK_BAD_T: sprintf(name, "ARK_BAD_T"); break;
  case ARK_BAD_DKY: sprintf(name, "ARK_BAD_DKY"); break;
  case ARK_TOO_CLOSE: sprintf(name, "ARK_TOO_CLOSE"); break;
  case ARK_VECTOROP_ERR: sprintf(name, "ARK_VECTOROP_ERR"); break;
  case ARK_NLS_INIT_FAIL: sprintf(name, "ARK_NLS_INIT_FAIL"); break;
  case ARK_NLS_SETUP_FAIL: sprintf(name, "ARK_NLS_SETUP_FAIL"); break;
  case ARK_NLS_SETUP_RECVR: sprintf(name, "ARK_NLS_SETUP_RECVR"); break;
  case ARK_NLS_OP_ERR: sprintf(name, "ARK_NLS_OP_ERR"); break;
  case ARK_INNERSTEP_ATTACH_ERR:
    sprintf(name, "ARK_INNERSTEP_ATTACH_ERR");
    break;
  case ARK_INNERSTEP_FAIL: sprintf(name, "ARK_INNERSTEP_FAIL"); break;
  case ARK_OUTERTOINNER_FAIL: sprintf(name, "ARK_OUTERTOINNER_FAIL"); break;
  case ARK_INNERTOOUTER_FAIL: sprintf(name, "ARK_INNERTOOUTER_FAIL"); break;
  case ARK_POSTPROCESS_STEP_FAIL:
    sprintf(name, "ARK_POSTPROCESS_STEP_FAIL");
    break;
  case ARK_POSTPROCESS_STAGE_FAIL:
    sprintf(name, "ARK_POSTPROCESS_STAGE_FAIL");
    break;
  case ARK_USER_PREDICT_FAIL: sprintf(name, "ARK_USER_PREDICT_FAIL"); break;
  case ARK_INTERP_FAIL: sprintf(name, "ARK_INTERP_FAIL"); break;
  case ARK_INVALID_TABLE: sprintf(name, "ARK_INVALID_TABLE"); break;
  case ARK_CONTEXT_ERR: sprintf(name, "ARK_CONTEXT_ERR"); break;
  case ARK_RELAX_FAIL: sprintf(name, "ARK_RELAX_FAIL"); break;
  case ARK_RELAX_MEM_NULL: sprintf(name, "ARK_RELAX_MEM_NULL"); break;
  case ARK_RELAX_FUNC_FAIL: sprintf(name, "ARK_RELAX_FUNC_FAIL"); break;
  case ARK_RELAX_JAC_FAIL: sprintf(name, "ARK_RELAX_JAC_FAIL"); break;
  case ARK_CONTROLLER_ERR: sprintf(name, "ARK_CONTROLLER_ERR"); break;
  case ARK_STEPPER_UNSUPPORTED: sprintf(name, "ARK_STEPPER_UNSUPPORTED"); break;
  case ARK_UNRECOGNIZED_ERROR: sprintf(name, "ARK_UNRECOGNIZED_ERROR"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}